

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O0

uint8_t * bstr_while_predicate_reverse(uint8_t *pBegin,uint8_t *pEnd,_func_int_int *pred_func)

{
  int iVar1;
  int c;
  uint8_t *pTest;
  uint8_t *pNext;
  _func_int_int *pred_func_local;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  
  pTest = pEnd;
  pBegin_local = pBegin;
  if (pBegin < pEnd) {
    while ((pBegin < pTest && (iVar1 = (*pred_func)((int)pTest[-1]), iVar1 != 0))) {
      pTest = pTest + -1;
    }
    pBegin_local = pTest;
  }
  return pBegin_local;
}

Assistant:

const uint8_t *bstr_while_predicate_reverse(const uint8_t *pBegin, const uint8_t *pEnd, int (*pred_func)(int c) )
{
   if (pBegin < pEnd)
   {
      const uint8_t *pNext = pEnd;
      while (pNext > pBegin)
      {
         const uint8_t *pTest = pNext-1;
         int c = (int) *pTest;
         if (!pred_func(c)){
            break;
         }
         pNext--;
      }
      return pNext;
   }
   return pBegin;
}